

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

bool __thiscall Reducer::reduceFunctions(Reducer *this)

{
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> __args;
  char *pcVar3;
  bool bVar4;
  ostream *poVar5;
  size_type sVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar12;
  size_t max;
  long lVar13;
  Name NVar14;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_e0;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_d8;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_c0;
  size_t local_a8;
  size_t local_a0;
  undefined1 auStack_98 [8];
  value_type name;
  ulong local_80;
  undefined1 auStack_78 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  pointer pNStack_58;
  vector<wasm::Name,_std::allocator<wasm::Name>_> functionNames;
  bool local_31;
  
  pNStack_58 = (pointer)0x0;
  functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  puVar12 = *(pointer *)
             &(pMVar1->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            + 8);
  if (puVar12 != puVar2) {
    do {
      __args.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (puVar12->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
      if (functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start ==
          functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                  ((vector<wasm::Name,std::allocator<wasm::Name>> *)&pNStack_58,
                   (iterator)
                   functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                   .super__Vector_impl_data._M_start,
                   (Name *)__args.
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
      else {
        pcVar3 = *(char **)((long)__args.
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
        ((functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start)->super_IString).str._M_len =
             *(size_t *)
              __args.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        ((functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar3;
        functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start =
             functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar2);
  }
  if ((long)functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start - (long)pNStack_58 != 0) {
    max = (long)functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start - (long)pNStack_58 >> 4;
    local_a8 = deterministicRandom(this,max);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|    try to remove functions (base: ",0x24);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", decisionCounter: ",0x13);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", numFuncs ",0xb);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
    if (functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start != pNStack_58) {
      local_31 = true;
      uVar11 = 0;
      uVar10 = 1;
      local_80 = 1;
      local_a0 = max;
      do {
        uVar8 = (local_a8 + uVar11) % max;
        if ((local_31 == false) &&
           (sVar6 = std::
                    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::count(&functionsWeTriedToRemove._M_h,pNStack_58 + uVar8), sVar6 == 1)) {
          iVar9 = this->factor / 5;
          if (iVar9 < 20000) {
            iVar9 = 19999;
          }
          bVar4 = shouldTryToReduce(this,(ulong)(iVar9 + 1));
          if (bVar4) goto LAB_001290e9;
        }
        else {
LAB_001290e9:
          auStack_78 = (undefined1  [8])0x0;
          names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if ((uVar10 != 0) &&
             (uVar8 < (ulong)((long)functionNames.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_start - (long)pNStack_58 >> 4
                             ))) {
            lVar13 = 0;
            do {
              auStack_98 = (undefined1  [8])pNStack_58[lVar13 + uVar8].super_IString.str._M_len;
              name.super_IString.str._M_len =
                   (size_t)pNStack_58[lVar13 + uVar8].super_IString.str._M_str;
              NVar14.super_IString.str._M_str = (char *)auStack_98;
              NVar14.super_IString.str._M_len =
                   (size_t)(this->module)._M_t.
                           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                           .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
              lVar7 = wasm::Module::getFunctionOrNull(NVar14);
              if (lVar7 != 0) {
                if (names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  std::vector<wasm::Name,std::allocator<wasm::Name>>::
                  _M_realloc_insert<wasm::Name_const&>
                            ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_78,
                             (iterator)
                             names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                             _M_impl.super__Vector_impl_data._M_start,(Name *)auStack_98);
                }
                else {
                  *(undefined4 *)
                   &((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_start)->super_IString).str._M_len =
                       auStack_98._0_4_;
                  *(undefined4 *)
                   ((long)&((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                             _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_len +
                   4) = auStack_98._4_4_;
                  *(undefined4 *)
                   &((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_start)->super_IString).str._M_str =
                       (undefined4)name.super_IString.str._M_len;
                  *(undefined4 *)
                   ((long)&((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                             _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_str +
                   4) = name.super_IString.str._M_len._4_4_;
                  names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                }
                local_e0 = &functionsWeTriedToRemove;
                std::
                _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                          ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)&functionsWeTriedToRemove,auStack_98,&local_e0);
              }
            } while (((ulong)((long)names.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 4
                             ) < uVar10) &&
                    (lVar7 = lVar13 + uVar8, lVar13 = lVar13 + 1,
                    lVar7 + 1U <
                    (ulong)((long)functionNames.
                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                  _M_impl.super__Vector_impl_data._M_start - (long)pNStack_58 >> 4))
                    );
          }
          max = local_a0;
          if ((undefined1  [8])
              names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start != auStack_78) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"|     trying at i=",0x12);
            max = local_a0;
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," of size ",9);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                      (&local_d8,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78);
            bVar4 = tryToEmptyFunctions(this,&local_d8);
            local_31 = true;
            if (!bVar4) {
              std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                        (&local_c0,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78);
              local_31 = tryToRemoveFunctions(this,&local_c0);
              if (local_c0.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c0.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_c0.
                                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c0.
                                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            if (local_d8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_d8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_d8.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_d8.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_31 == false) {
              uVar8 = uVar10 >> 1;
              if (uVar10 < 2) {
                uVar8 = 1;
              }
              lVar13 = (long)(this->factor / 100);
            }
            else {
              this->reduced =
                   this->reduced +
                   ((long)names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)auStack_78 >> 4);
              applyTestToWorking(this);
              lVar13 = uVar10 - 1;
              uVar8 = uVar10 * 2;
              if ((ulong)(long)this->factor <= uVar10 * 2) {
                uVar8 = (long)this->factor;
              }
              if (local_80 < uVar8) {
                local_80 = uVar8;
              }
            }
            uVar11 = uVar11 + lVar13;
            uVar10 = uVar8;
          }
          if (auStack_78 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_78,
                            (long)names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)functionNames.
                                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                      _M_impl.super__Vector_impl_data._M_start - (long)pNStack_58 >>
                               4));
      bVar4 = 2 < local_80;
      goto LAB_001293a2;
    }
  }
  bVar4 = false;
LAB_001293a2:
  if (pNStack_58 != (pointer)0x0) {
    operator_delete(pNStack_58,
                    (long)functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pNStack_58);
  }
  return bVar4;
}

Assistant:

bool reduceFunctions() {
    // try to remove functions
    std::vector<Name> functionNames;
    for (auto& func : module->functions) {
      functionNames.push_back(func->name);
    }
    auto numFuncs = functionNames.size();
    if (numFuncs == 0) {
      return false;
    }
    size_t skip = 1;
    size_t maxSkip = 1;
    // If we just removed some functions in the previous iteration, keep trying
    // to remove more as this is one of the most efficient ways to reduce.
    bool justReduced = true;
    // Start from a new place each time.
    size_t base = deterministicRandom(numFuncs);
    std::cerr << "|    try to remove functions (base: " << base
              << ", decisionCounter: " << decisionCounter << ", numFuncs "
              << numFuncs << ")\n";
    for (size_t x = 0; x < functionNames.size(); x++) {
      size_t i = (base + x) % numFuncs;
      if (!justReduced &&
          functionsWeTriedToRemove.count(functionNames[i]) == 1 &&
          !shouldTryToReduce(std::max((factor / 5) + 1, 20000))) {
        continue;
      }
      std::vector<Name> names;
      for (size_t j = 0; names.size() < skip && i + j < functionNames.size();
           j++) {
        auto name = functionNames[i + j];
        if (module->getFunctionOrNull(name)) {
          names.push_back(name);
          functionsWeTriedToRemove.insert(name);
        }
      }
      if (names.size() == 0) {
        continue;
      }
      std::cerr << "|     trying at i=" << i << " of size " << names.size()
                << "\n";
      // Try to remove functions and/or empty them. Note that
      // tryToRemoveFunctions() will reload the module if it fails, which means
      // function names may change - for that reason, run it second.
      justReduced = tryToEmptyFunctions(names) || tryToRemoveFunctions(names);
      if (justReduced) {
        noteReduction(names.size());
        // Subtract 1 since the loop increments us anyhow by one: we want to
        // skip over the skipped functions, and not any more.
        x += skip - 1;
        skip = std::min(size_t(factor), 2 * skip);
        maxSkip = std::max(skip, maxSkip);
      } else {
        skip = std::max(skip / 2, size_t(1)); // or 1?
        x += factor / 100;
      }
    }
    // If maxSkip is 1 then we never reduced at all. If it is 2 then we did
    // manage to reduce individual functions, but all our attempts at
    // exponential growth failed. Only suggest doing a new iteration of this
    // function if we did in fact manage to grow, which indicated there are lots
    // of opportunities here, and it is worth focusing on this.
    return maxSkip > 2;
  }